

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O2

void __thiscall
GenericModelItem::sortChildren
          (GenericModelItem *this,int column,int role,SortOrder order,bool recursive,
          QModelIndexList *persistentIndexes,QVector<RolesContainer> *headersToSort)

{
  uint uVar1;
  QMap<int,_QVariant> *pQVar2;
  parameter_type t;
  qsizetype qVar3;
  bool bVar4;
  int iVar5;
  iterator iVar6;
  iterator iVar7;
  ulong uVar8;
  reference this_00;
  ulong uVar9;
  int i;
  ulong uVar10;
  long lVar11;
  QVector<RolesContainer> updatedHeadersToSort;
  QVector<GenericModelItem_*> columnChildren;
  QModelIndexList changedPersistentIndexesFrom;
  QVector<GenericModelItem_*> newChildren;
  QModelIndexList changedPersistentIndexesTo;
  QModelIndex local_60;
  QModelIndex local_48;
  
  uVar8 = (this->children).d.size;
  if (uVar8 == 0) {
    return;
  }
  if (this->m_colCount <= column) {
    return;
  }
  if (recursive) {
    uVar9 = 0;
    uVar10 = uVar8 & 0xffffffff;
    if ((int)uVar8 < 1) {
      uVar10 = uVar9;
    }
    for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
      sortChildren((this->children).d.ptr[uVar9],column,role,order,true,persistentIndexes,
                   (QVector<RolesContainer> *)0x0);
    }
  }
  columnChildren.d.d = (Data *)0x0;
  columnChildren.d.ptr = (GenericModelItem **)0x0;
  columnChildren.d.size = 0;
  QList<GenericModelItem_*>::reserve(&columnChildren,(long)this->m_rowCount);
  qVar3 = (this->children).d.size;
  for (; column < (int)qVar3; column = column + this->m_colCount) {
    QList<GenericModelItem_*>::append(&columnChildren,(this->children).d.ptr[column]);
  }
  if (order == AscendingOrder) {
    iVar6 = QList<GenericModelItem_*>::begin(&columnChildren);
    iVar7 = QList<GenericModelItem_*>::end(&columnChildren);
    if (iVar6.i == iVar7.i) goto LAB_0012cd68;
    std::_Temporary_buffer<QList<GenericModelItem_*>::iterator,_GenericModelItem_*>::
    _Temporary_buffer((_Temporary_buffer<QList<GenericModelItem_*>::iterator,_GenericModelItem_*> *)
                      &updatedHeadersToSort,iVar6,(((long)iVar7.i - (long)iVar6.i >> 3) + 1) / 2);
    if (updatedHeadersToSort.d.size == 0) {
      std::
      __inplace_stable_sort<QList<GenericModelItem*>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<GenericModelItem::sortChildren(int,int,Qt::SortOrder,bool,QList<QModelIndex>const&,QList<QMap<int,QVariant>>*)::__0>>
                (iVar6,iVar7,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_VSRonin[P]QtModelUtilities_src_genericmodel_cpp:434:33)>
                  )role);
    }
    else {
      std::
      __stable_sort_adaptive<QList<GenericModelItem*>::iterator,GenericModelItem**,long_long,__gnu_cxx::__ops::_Iter_comp_iter<GenericModelItem::sortChildren(int,int,Qt::SortOrder,bool,QList<QModelIndex>const&,QList<QMap<int,QVariant>>*)::__0>>
                (iVar6,iVar7,(GenericModelItem **)updatedHeadersToSort.d.size,
                 (longlong)updatedHeadersToSort.d.ptr,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_VSRonin[P]QtModelUtilities_src_genericmodel_cpp:434:33)>
                  )role);
    }
  }
  else {
    iVar6 = QList<GenericModelItem_*>::begin(&columnChildren);
    iVar7 = QList<GenericModelItem_*>::end(&columnChildren);
    if (iVar6.i == iVar7.i) goto LAB_0012cd68;
    std::_Temporary_buffer<QList<GenericModelItem_*>::iterator,_GenericModelItem_*>::
    _Temporary_buffer((_Temporary_buffer<QList<GenericModelItem_*>::iterator,_GenericModelItem_*> *)
                      &updatedHeadersToSort,iVar6,(((long)iVar7.i - (long)iVar6.i >> 3) + 1) / 2);
    if (updatedHeadersToSort.d.size == 0) {
      std::
      __inplace_stable_sort<QList<GenericModelItem*>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<GenericModelItem::sortChildren(int,int,Qt::SortOrder,bool,QList<QModelIndex>const&,QList<QMap<int,QVariant>>*)::__1>>
                (iVar6,iVar7,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_VSRonin[P]QtModelUtilities_src_genericmodel_cpp:437:36)>
                  )role);
    }
    else {
      std::
      __stable_sort_adaptive<QList<GenericModelItem*>::iterator,GenericModelItem**,long_long,__gnu_cxx::__ops::_Iter_comp_iter<GenericModelItem::sortChildren(int,int,Qt::SortOrder,bool,QList<QModelIndex>const&,QList<QMap<int,QVariant>>*)::__1>>
                (iVar6,iVar7,(GenericModelItem **)updatedHeadersToSort.d.size,
                 (longlong)updatedHeadersToSort.d.ptr,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_VSRonin[P]QtModelUtilities_src_genericmodel_cpp:437:36)>
                  )role);
    }
  }
  std::_Temporary_buffer<QList<GenericModelItem_*>::iterator,_GenericModelItem_*>::
  ~_Temporary_buffer((_Temporary_buffer<QList<GenericModelItem_*>::iterator,_GenericModelItem_*> *)
                     &updatedHeadersToSort);
LAB_0012cd68:
  updatedHeadersToSort.d.d = (Data *)0x0;
  updatedHeadersToSort.d.ptr = (QMap<int,_QVariant> *)0x0;
  updatedHeadersToSort.d.size = 0;
  if (headersToSort != (QVector<RolesContainer> *)0x0) {
    changedPersistentIndexesFrom.d.d = (Data *)0x0;
    QList<QMap<int,_QVariant>_>::QList
              ((QList<QMap<int,_QVariant>_> *)&newChildren,(headersToSort->d).size,
               (parameter_type)&changedPersistentIndexesFrom);
    QArrayDataPointer<QMap<int,_QVariant>_>::operator=
              (&updatedHeadersToSort.d,(QArrayDataPointer<QMap<int,_QVariant>_> *)&newChildren);
    QArrayDataPointer<QMap<int,_QVariant>_>::~QArrayDataPointer
              ((QArrayDataPointer<QMap<int,_QVariant>_> *)&newChildren);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2
              ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                *)&changedPersistentIndexesFrom);
  }
  newChildren.d.d = (Data *)0x0;
  newChildren.d.ptr = (GenericModelItem **)0x0;
  newChildren.d.size = 0;
  QList<GenericModelItem_*>::reserve(&newChildren,(this->children).d.size);
  changedPersistentIndexesFrom.d.size = 0;
  changedPersistentIndexesFrom.d.d = (Data *)0x0;
  changedPersistentIndexesFrom.d.ptr = (QModelIndex *)0x0;
  changedPersistentIndexesTo.d.d = (Data *)0x0;
  changedPersistentIndexesTo.d.ptr = (QModelIndex *)0x0;
  changedPersistentIndexesTo.d.size = 0;
  uVar10 = 0;
  uVar8 = columnChildren.d.size & 0xffffffff;
  if ((int)columnChildren.d.size < 1) {
    uVar8 = uVar10;
  }
  for (; uVar10 != uVar8; uVar10 = uVar10 + 1) {
    uVar1 = columnChildren.d.ptr[uVar10]->m_row;
    if (headersToSort != (QVector<RolesContainer> *)0x0) {
      pQVar2 = (headersToSort->d).ptr;
      this_00 = QList<QMap<int,_QVariant>_>::operator[](&updatedHeadersToSort,uVar10);
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
      ::operator=(&this_00->d,&pQVar2[(int)uVar1].d);
    }
    iVar5 = this->m_colCount;
    for (lVar11 = (long)(int)(iVar5 * uVar1); lVar11 < (int)(iVar5 * (uVar1 + 1));
        lVar11 = lVar11 + 1) {
      t = (this->children).d.ptr[lVar11];
      if (uVar10 != uVar1) {
        local_48.m = &this->m_model->super_QAbstractItemModel;
        local_48.r = t->m_row;
        local_48.c = t->m_column;
        local_48.i = (quintptr)t;
        bVar4 = QListSpecialMethodsBase<QModelIndex>::contains<QModelIndex>
                          ((QListSpecialMethodsBase<QModelIndex> *)persistentIndexes,&local_48);
        if (bVar4) {
          QList<QModelIndex>::emplaceBack<QModelIndex_const&>
                    (&changedPersistentIndexesFrom,&local_48);
          local_60.m = &this->m_model->super_QAbstractItemModel;
          local_60.c = t->m_column;
          local_60.r = (int)uVar10;
          local_60.i = (quintptr)t;
          QList<QModelIndex>::emplaceBack<QModelIndex>(&changedPersistentIndexesTo,&local_60);
        }
        t->m_row = (int)uVar10;
      }
      QList<GenericModelItem_*>::append(&newChildren,t);
      iVar5 = this->m_colCount;
    }
  }
  QArrayDataPointer<GenericModelItem_*>::operator=(&(this->children).d,&newChildren.d);
  if (headersToSort != (QVector<RolesContainer> *)0x0) {
    QArrayDataPointer<QMap<int,_QVariant>_>::operator=(&headersToSort->d,&updatedHeadersToSort.d);
  }
  QAbstractItemModel::changePersistentIndexList
            ((QList_conflict *)this->m_model,(QList_conflict *)&changedPersistentIndexesFrom);
  QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&changedPersistentIndexesTo.d);
  QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&changedPersistentIndexesFrom.d);
  QArrayDataPointer<GenericModelItem_*>::~QArrayDataPointer(&newChildren.d);
  QArrayDataPointer<QMap<int,_QVariant>_>::~QArrayDataPointer(&updatedHeadersToSort.d);
  QArrayDataPointer<GenericModelItem_*>::~QArrayDataPointer(&columnChildren.d);
  return;
}

Assistant:

void GenericModelItem::sortChildren(int column, int role, Qt::SortOrder order, bool recursive, const QModelIndexList &persistentIndexes,
                                    QVector<RolesContainer> *headersToSort)
{
    Q_ASSERT(column >= 0);
    if (children.isEmpty() || column >= m_colCount)
        return;
    if (recursive) {
        for (int i = 0, maxI = children.size(); i < maxI; ++i)
            children.at(i)->sortChildren(column, role, order, recursive, persistentIndexes, nullptr);
    }
    QVector<GenericModelItem *> columnChildren;
    columnChildren.reserve(m_rowCount);
    for (int i = column, maxI = children.size(); i < maxI; i += m_colCount) {
        GenericModelItem *columnChild = children.at(i);
        columnChildren.append(columnChild);
    }
    const auto lessComparison = [role](const GenericModelItem *a, const GenericModelItem *b) -> bool {
        return GenericModelPrivate::isVariantLessThan(a->data.value(role), b->data.value(role));
    };
    const auto greaterComparison = [role](const GenericModelItem *a, const GenericModelItem *b) -> bool {
        return GenericModelPrivate::isVariantLessThan(b->data.value(role), a->data.value(role));
    };
    if (order == Qt::AscendingOrder)
        std::stable_sort(columnChildren.begin(), columnChildren.end(), lessComparison);
    else
        std::stable_sort(columnChildren.begin(), columnChildren.end(), greaterComparison);
    QVector<RolesContainer> updatedHeadersToSort;
    if (headersToSort)
        updatedHeadersToSort = QVector<RolesContainer>(headersToSort->size(), RolesContainer());
    QVector<GenericModelItem *> newChildren;
    newChildren.reserve(children.size());
    QModelIndexList changedPersistentIndexesFrom, changedPersistentIndexesTo;
    for (int toRow = 0, maxRow = columnChildren.size(); toRow < maxRow; ++toRow) {
        GenericModelItem *const columnChild = columnChildren.at(toRow);
        const int fromRow = columnChild->m_row;
        if (headersToSort)
            updatedHeadersToSort[toRow] = headersToSort->at(fromRow);
        for (int i = m_colCount * fromRow; i < m_colCount * (fromRow + 1); ++i) {
            GenericModelItem *const iChild = children.at(i);
            if (toRow != fromRow) {
                QModelIndex fromIdx = m_model->createIndex(iChild->m_row, iChild->m_column, iChild);
                if (persistentIndexes.contains(fromIdx)) {
                    changedPersistentIndexesFrom.append(fromIdx);
                    changedPersistentIndexesTo.append(m_model->createIndex(toRow, iChild->m_column, iChild));
                }
                iChild->m_row = toRow;
            }
            newChildren.append(iChild);
        }
    }
    Q_ASSERT(newChildren.size() == children.size());
    Q_ASSERT(std::all_of(newChildren.constBegin(), newChildren.constEnd(), [](const GenericModelItem *a) -> bool { return a != nullptr; }));
    children = newChildren;
    if (headersToSort)
        *headersToSort = updatedHeadersToSort;
    m_model->changePersistentIndexList(changedPersistentIndexesFrom, changedPersistentIndexesTo);
}